

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type * __thiscall
FadBinaryDiv<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>_>::val
          (value_type *__return_storage_ptr__,
          FadBinaryDiv<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>_>
          *this)

{
  double dVar1;
  value_type local_50;
  FadExpr<FadBinaryDiv<FadCst<double>,_Fad<double>_>_> local_30;
  
  dVar1 = (this->left_).constant_;
  FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>::val(&local_50,&this->right_->fadexpr_);
  local_30.fadexpr_.left_.defaultVal = 0.0;
  local_30.fadexpr_.left_.constant_ = dVar1;
  local_30.fadexpr_.right_ = &local_50;
  Fad<double>::Fad<FadBinaryDiv<FadCst<double>,Fad<double>>>(__return_storage_ptr__,&local_30);
  Fad<double>::~Fad(&local_50);
  return __return_storage_ptr__;
}

Assistant:

const value_type val() const {return left_.val() / right_.val();}